

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

string * absl::StrCat_abi_cxx11_(AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d)

{
  long lVar1;
  Nonnull<char_*> pcVar2;
  AlphaNum *x;
  long lVar3;
  string *in_RDI;
  char *out;
  char *begin;
  char *absl_raw_log_internal_filename;
  string death_message;
  uint64_t result_size;
  uint64_t kMaxSize;
  string *result;
  size_t in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  AlphaNum *in_stack_fffffffffffffed8;
  Nonnull<char_*> in_stack_fffffffffffffee0;
  
  std::__cxx11::string::string((string *)in_RDI);
  AlphaNum::size((AlphaNum *)0x3beb42);
  AlphaNum::size((AlphaNum *)0x3beb59);
  AlphaNum::size((AlphaNum *)0x3beb82);
  AlphaNum::size((AlphaNum *)0x3beba8);
  strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  lVar1 = std::__cxx11::string::operator[]((ulong)in_RDI);
  pcVar2 = anon_unknown_5::Append(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  x = (AlphaNum *)anon_unknown_5::Append(pcVar2,in_stack_fffffffffffffed8);
  anon_unknown_5::Append(pcVar2,x);
  pcVar2 = anon_unknown_5::Append(pcVar2,x);
  lVar3 = std::__cxx11::string::size();
  if (pcVar2 == (Nonnull<char_*>)(lVar1 + lVar3)) {
    return in_RDI;
  }
  __assert_fail("out == begin + result.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                ,0x78,
                "std::string absl::StrCat(const AlphaNum &, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
               );
}

Assistant:

std::string StrCat(const AlphaNum& a, const AlphaNum& b, const AlphaNum& c,
                   const AlphaNum& d) {
  std::string result;
  // Use uint64_t to prevent size_t overflow. We assume it is not possible for
  // in memory strings to overflow a uint64_t.
  constexpr uint64_t kMaxSize = uint64_t{std::numeric_limits<size_t>::max()};
  const uint64_t result_size = static_cast<uint64_t>(a.size()) +
                               static_cast<uint64_t>(b.size()) +
                               static_cast<uint64_t>(c.size()) +
                               static_cast<uint64_t>(d.size());
  ABSL_INTERNAL_CHECK(result_size <= kMaxSize, "size_t overflow");
  strings_internal::STLStringResizeUninitialized(
      &result, static_cast<size_t>(result_size));
  char* const begin = &result[0];
  char* out = begin;
  out = Append(out, a);
  out = Append(out, b);
  out = Append(out, c);
  out = Append(out, d);
  assert(out == begin + result.size());
  return result;
}